

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

prf_node_t * prf_node_clone(prf_node_t *node,prf_model_t *source,prf_model_t *target)

{
  prf_nodeinfo_t *ppVar1;
  uint8_t *puVar2;
  prf_model_t *in_RDX;
  prf_model_t *in_RSI;
  prf_node_t *in_RDI;
  prf_node_t *newnode;
  prf_nodeinfo_t *info;
  uint16_t in_stack_ffffffffffffffce;
  prf_node_t *local_30;
  prf_node_t *local_8;
  
  ppVar1 = prf_nodeinfo_get(in_stack_ffffffffffffffce);
  if ((ppVar1 == (prf_nodeinfo_t *)0x0) ||
     (ppVar1->clone_f == (_func_prf_node_t_ptr_prf_node_t_ptr_prf_model_t_ptr_prf_model_t_ptr *)0x0)
     ) {
    if (in_RDX->mempool_id == 0) {
      local_30 = prf_node_create();
    }
    else {
      local_30 = (prf_node_t *)pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
      prf_node_clear(local_30);
    }
    if (local_30 == (prf_node_t *)0x0) {
      prf_error(9,"memory allocation failure (returned NULL)");
      local_8 = (prf_node_t *)0x0;
    }
    else {
      local_30->opcode = in_RDI->opcode;
      local_30->length = in_RDI->length;
      if (in_RDX->mempool_id != 0) {
        local_30->flags = local_30->flags | 0x100;
      }
      if ((in_RDI->length < 5) || (in_RDX->mempool_id != 0)) {
        if (4 < in_RDI->length) {
          puVar2 = (uint8_t *)pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
          local_30->data = puVar2;
        }
      }
      else {
        puVar2 = (uint8_t *)malloc((long)(int)(in_RDI->length - 4));
        local_30->data = puVar2;
      }
      if ((in_RDI->length < 5) || (local_30->data != (uint8_t *)0x0)) {
        memcpy(local_30->data,in_RDI->data,(long)(int)(in_RDI->length - 4));
        local_8 = local_30;
      }
      else {
        prf_error(9,"memory allocation failure (returned NULL)");
        if (in_RDX->mempool_id == 0) {
          free(local_30);
        }
        local_8 = (prf_node_t *)0x0;
      }
    }
  }
  else {
    local_8 = (*ppVar1->clone_f)(in_RDI,in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

prf_node_t *
prf_node_clone(
    prf_node_t * node,
    prf_model_t * source,
    prf_model_t * target )
{
    prf_nodeinfo_t * info;

    assert( node != NULL && target != NULL );

    info = prf_nodeinfo_get( node->opcode );
    if ( info != NULL && info->clone_f != NULL ) {
        return (*(info->clone_f))( node, source, target );
    } else {
        prf_node_t * newnode;
        if ( target->mempool_id == 0 ) {
            newnode = prf_node_create();
        } else {
            newnode = (prf_node_t *)pool_malloc( target->mempool_id, 
						 sizeof( prf_node_t ) );
            prf_node_clear( newnode );
        }
        if ( newnode == NULL ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            return NULL;
        }
        newnode->opcode = node->opcode;
        newnode->length = node->length;
        if ( target->mempool_id != 0 )
            newnode->flags |= PRF_NODE_MEMPOOLED;
        if ( (node->length > 4) && (target->mempool_id == 0) )
            newnode->data = (uint8_t *)malloc( node->length - 4 );
        else if ( node->length > 4 )
            newnode->data = (uint8_t *)pool_malloc( target->mempool_id, 
						    node->length - 4 );
        if ( (node->length > 4) && (newnode->data == NULL) ) {
            prf_error( 9, "memory allocation failure (returned NULL)" );
            if ( target->mempool_id == 0 )
                free( newnode );
            return NULL;
        }
        memcpy( newnode->data, node->data, node->length - 4 );
        return newnode;
    }
}